

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  void *__buf;
  bool bVar1;
  int iVar2;
  void *__ptr;
  char *__s_00;
  char *pcVar3;
  light_pcapng_stream p_Var4;
  light_pcapng p_Var5;
  uint32_t *__buf_00;
  size_t sVar6;
  ulong uVar7;
  char **ppcVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint local_108c;
  uint32_t *local_1088;
  uint local_1080;
  size_t local_1068;
  int local_105c;
  char *local_1058;
  long local_1050;
  long local_1048;
  char *local_1040;
  char trace_path [4096];
  
  local_108c = 0;
  while( true ) {
    do {
      while( true ) {
        do {
          iVar2 = getopt(argc,argv,"n:t:b:f:c");
        } while (iVar2 == 0x62);
        if (iVar2 != 99) break;
        for (ppcVar8 = argv + _optind; *ppcVar8 != (char *)0x0; ppcVar8 = ppcVar8 + 1) {
          iVar2 = access(*ppcVar8,4);
          if (iVar2 == 0) {
            p_Var4 = light_open_stream(*ppcVar8);
            if (p_Var4 == (light_pcapng_stream)0x0) {
              uVar9 = 0;
              fprintf(_stderr,"Failed to open %s\n",*ppcVar8);
            }
            else {
              uVar9 = 0;
              do {
                uVar9 = (ulong)((int)uVar9 + 1);
                p_Var5 = light_read_stream(p_Var4);
              } while (p_Var5 != (light_pcapng)0x0);
            }
            light_close_stream(p_Var4);
            printf("--> %s has %u blocks\n",*ppcVar8,uVar9);
          }
        }
      }
    } while ((iVar2 == 0x66) || (iVar2 == 0x74));
    if (iVar2 == -1) break;
    if (iVar2 != 0x6e) {
      exit(1);
    }
    local_108c = atoi(_optarg);
    printf("Set packet limit to %d\n",(ulong)local_108c);
  }
  if (local_108c != 0) {
    lVar13 = (long)argc;
    local_1050 = lVar13;
    for (lVar11 = 1; lVar11 < lVar13; lVar11 = lVar11 + 1) {
      iVar2 = access(argv[lVar11],4);
      if (iVar2 == 0) {
        __s = argv[lVar11];
        __ptr = calloc(1,8);
        memset(trace_path,0,0x1000);
        __s_00 = strdup(__s);
        pcVar3 = strrchr(__s_00,0x2e);
        *pcVar3 = '\0';
        local_1040 = __s;
        p_Var4 = light_open_stream(__s);
        if (p_Var4 == (light_pcapng_stream)0x0) {
          free(__ptr);
          free(__s_00);
        }
        else {
          sprintf(trace_path,"%s_%04d.pcapng",__s_00,0);
          iVar2 = open(trace_path,0x42,0x1b6);
          if (iVar2 == -1) {
            fprintf(_stderr,"Unable to open file for write: %s\n",trace_path);
            free(__ptr);
            free(__s_00);
            light_close_stream(p_Var4);
          }
          else {
            uVar12 = 0;
            uVar10 = 0;
            local_1080 = 1;
            local_1088 = (uint32_t *)0x0;
            local_105c = iVar2;
            local_1058 = __s_00;
            local_1048 = lVar11;
            while( true ) {
              local_1068 = 0;
              p_Var5 = light_read_stream(p_Var4);
              __buf_00 = light_pcapng_to_memory(p_Var5,&local_1068);
              if (__buf_00 == (uint32_t *)0x0) break;
              if (*__buf_00 == 1) {
                if (uVar10 == local_1080) {
                  local_1080 = uVar10 * 2;
                  __ptr = realloc(__ptr,(long)(int)local_1080);
                }
                *(uint32_t **)((long)__ptr + (long)(int)uVar10 * 8) = __buf_00;
                uVar10 = uVar10 + 1;
                bVar1 = false;
              }
              else if (*__buf_00 == 0xa0d0d0a) {
                if (local_1088 != (uint32_t *)0x0) {
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
                    free(*(void **)((long)__ptr + uVar9 * 8));
                    *(undefined8 *)((long)__ptr + uVar9 * 8) = 0;
                  }
                  free(local_1088);
                  uVar10 = 0;
                }
                __buf_00[4] = 0xffffffff;
                __buf_00[5] = 0xffffffff;
                bVar1 = false;
                local_1088 = __buf_00;
              }
              else {
                uVar12 = uVar12 + 1;
                bVar1 = true;
              }
              sVar6 = write(iVar2,__buf_00,local_1068);
              if (sVar6 != local_1068) {
                fprintf(_stderr,"Warning: write error occurred for %s: failed to write %zu bytes\n."
                        ,trace_path);
              }
              if (bVar1) {
                free(__buf_00);
              }
              if (uVar12 == local_108c) {
                close(iVar2);
                sprintf(trace_path,"%s_%04d.pcapng",local_1058);
                iVar2 = open(trace_path,0x42,0x1b6);
                uVar9 = write(iVar2,local_1088,(ulong)local_1088[1]);
                if (uVar9 != local_1088[1]) {
                  fprintf(_stderr,
                          "Warning: write error occurred for %s: failed to write %u bytes\n.",
                          trace_path);
                }
                uVar9 = 0;
                if (0 < (int)uVar10) {
                  uVar9 = (ulong)uVar10;
                }
                for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
                  __buf = *(void **)((long)__ptr + uVar14 * 8);
                  uVar7 = write(iVar2,__buf,(ulong)*(uint *)((long)__buf + 4));
                  if (uVar7 != *(uint *)(*(long *)((long)__ptr + uVar14 * 8) + 4)) {
                    fprintf(_stderr,
                            "Warning: write error occurred for %s: failed to write %u bytes\n.",
                            trace_path);
                  }
                }
                uVar12 = 0;
              }
            }
            printf("Split %s into %d files.\n",local_1040,(ulong)((iVar2 - local_105c) + 1));
            free(local_1058);
            close(iVar2);
            lVar13 = local_1050;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
              free(*(void **)((long)__ptr + uVar9 * 8));
            }
            free(__ptr);
            free(local_1088);
            light_close_stream(p_Var4);
            lVar11 = local_1048;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char * const argv[]) {
	// TODO: split trace in N intervals.
	// TODO: split trace in N bytes size.
	// ...
	// TODO: split trace using histogram function.
	int option = 0;
	int n = 0;

	while ((option = getopt(argc, argv, "n:t:b:f:c")) != -1) {
		switch (option) {
		case 'n':
			n = atoi(optarg);
			printf("Set packet limit to %d\n", n);
			break;
		case 't':
			break;
		case 'b':
			break;
		case 'f':
			break;
		case 'c':
			test_split_count(argc - optind, &argv[optind]);
			break;
		default:
			exit(EXIT_FAILURE);
		}
	}

	if (n != 0) {
		int i;
		for (i = 1; i < argc; ++i) {
			if (access(argv[i], F_OK | R_OK) == 0) {
				test_split_trace(n, argv[i]);
			}
		}
	}

	return 0;
}